

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O0

bool __thiscall WellFounded::propRule(WellFounded *this,ConjRule *r)

{
  bool *pbVar1;
  ConjRule **ppCVar2;
  ConjRule *in_RSI;
  long in_RDI;
  int x;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint index;
  bool local_1;
  
  while ((-1 < in_RSI->w &&
         (pbVar1 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),in_RSI->body[in_RSI->w]),
         (*pbVar1 & 1U) == 0))) {
    in_RSI->w = in_RSI->w + -1;
  }
  if (in_RSI->w < 0) {
    pbVar1 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),in_RSI->head);
    *pbVar1 = false;
    vec<int>::push((vec<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
    ppCVar2 = vec<ConjRule_*>::operator[]((vec<ConjRule_*> *)(in_RDI + 0x1a0),in_RSI->head);
    *ppCVar2 = in_RSI;
    local_1 = true;
  }
  else {
    index = in_RSI->body[in_RSI->w];
    vec<vec<ConjRule_*>_>::operator[]((vec<vec<ConjRule_*>_> *)(in_RDI + 0x138),index);
    vec<ConjRule_*>::push
              ((vec<ConjRule_*> *)CONCAT44(index,in_stack_ffffffffffffffe0),(ConjRule **)in_RSI);
    pbVar1 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x210),index);
    if ((*pbVar1 & 1U) == 0) {
      vec<int>::push((vec<int> *)CONCAT44(index,in_stack_ffffffffffffffe0),&in_RSI->head);
      pbVar1 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x210),index);
      *pbVar1 = true;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool propRule(ConjRule& r) {
		for (; r.w >= 0; r.w--) {
			if (no_support_bool[r.body[r.w]]) {
				break;
			}
		}
		if (r.w < 0) {
			if (DEBUG) {
				printf("found support for %d\n", r.head);
			}
			// all literals are founded, make h founded.
			no_support_bool[r.head] = false;
			nfset.push(r.head);
			support[r.head] = &r;
			return true;
		}
		const int x = r.body[r.w];
		watches[x].push(&r);
		if (!ufset_bool[x]) {
			if (DEBUG) {
				printf("%d added to ufset\n", x);
			}
			ufset.push(x);
			ufset_bool[x] = true;
		}
		return false;
	}